

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O0

void Abc_NtkCycleInitStateSop(Abc_Ntk_t *pNtk,int nFrames,int fVerbose)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  int local_30;
  int local_2c;
  int f;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsSopLogic(pNtk);
  if (iVar2 != 0) {
    srand(0x12341234);
    for (local_2c = 0; iVar2 = Abc_NtkPiNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_2c);
      uVar3 = rand();
      pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)(int)(uVar3 & 1);
    }
    for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar2; local_2c = local_2c + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_2c);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        iVar2 = Abc_LatchIsInit1(pAVar4);
        pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar2;
      }
    }
    p = Abc_NtkDfs(pNtk,0);
    for (local_30 = 0; local_30 < nFrames; local_30 = local_30 + 1) {
      for (local_2c = 0; iVar2 = Vec_PtrSize(p), local_2c < iVar2; local_2c = local_2c + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,local_2c);
        iVar2 = Abc_ObjSopSimulate(pAVar4);
        pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar2;
      }
      for (local_2c = 0; iVar2 = Abc_NtkCoNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
        pAVar4 = Abc_NtkCo(pNtk,local_2c);
        pAVar5 = Abc_ObjFanin0(pAVar4);
        pAVar4->field_6 = pAVar5->field_6;
      }
      for (local_2c = 0; iVar2 = Abc_NtkPiNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
        pAVar4 = Abc_NtkPi(pNtk,local_2c);
        uVar3 = rand();
        pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)(int)(uVar3 & 1);
      }
      for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar2;
          local_2c = local_2c + 1) {
        pAVar4 = Abc_NtkBox(pNtk,local_2c);
        iVar2 = Abc_ObjIsLatch(pAVar4);
        if (iVar2 != 0) {
          pAVar5 = Abc_ObjFanin0(pAVar4);
          aVar1 = pAVar5->field_6;
          pAVar4 = Abc_ObjFanout0(pAVar4);
          pAVar4->field_6 = aVar1;
        }
      }
    }
    Vec_PtrFree(p);
    for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar2; local_2c = local_2c + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_2c);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        pAVar5 = Abc_ObjFanout0(pAVar4);
        iVar2 = 1;
        if ((pAVar5->field_6).pTemp != (void *)0x0) {
          iVar2 = 2;
        }
        pAVar4->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)iVar2;
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retInit.c"
                ,0x13f,"void Abc_NtkCycleInitStateSop(Abc_Ntk_t *, int, int)");
}

Assistant:

void Abc_NtkCycleInitStateSop( Abc_Ntk_t * pNtk, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsSopLogic(pNtk) );
    srand( 0x12341234 );
    // initialize the values
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_LatchIsInit1(pObj);
    // simulate for the given number of timeframes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        // simulate internal nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // bring the results to the COs
        Abc_NtkForEachCo( pNtk, pObj, i )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        // assign PI values
        Abc_NtkForEachPi( pNtk, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
        // transfer the latch values
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
    Vec_PtrFree( vNodes );
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pData = (void *)(ABC_PTRUINT_T)(Abc_ObjFanout0(pObj)->pCopy ? ABC_INIT_ONE : ABC_INIT_ZERO);
}